

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmsockets.c
# Opt level: O3

attr_list libcmsockets_LTX_non_blocking_listen
                    (CManager cm,CMtrans_services_conflict svc,transport_entry_conflict trans,
                    attr_list listen_info)

{
  atom_t aVar1;
  int iVar2;
  int iVar3;
  uint __fd;
  __pid_t _Var4;
  int iVar5;
  time_t tVar6;
  void *pvVar7;
  attr_list p_Var8;
  char *pcVar9;
  undefined8 uVar10;
  int iVar11;
  attr_list p_Var12;
  ushort uVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  int iVar17;
  CManager p_Var18;
  int use_hostname;
  int port_range_high;
  int port_range_low;
  CManager local_178;
  sockaddr_in sock_addr;
  int IP;
  int sock_opt_val;
  attr_list local_150;
  int attr_port_num;
  uint length;
  transport_entry_conflict local_140;
  char host_name [256];
  
  p_Var12 = (attr_list)trans->trans_data;
  sock_opt_val = 1;
  attr_port_num = 0;
  use_hostname = 0;
  local_140 = trans;
  if ((*(CManager *)p_Var12 != (CManager)0x0) &&
     (iVar3 = (*svc->return_CM_lock_status)
                        (*(CManager *)p_Var12,
                         "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cmsockets.c"
                         ,0x29e), iVar3 == 0)) {
    __assert_fail("CM_LOCKED(svc, sd->cm)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cmsockets.c"
                  ,0x29e,
                  "attr_list libcmsockets_LTX_non_blocking_listen(CManager, CMtrans_services, transport_entry, attr_list)"
                 );
  }
  uVar14 = 0;
  local_178 = cm;
  local_150 = listen_info;
  if (listen_info == (attr_list)0x0) {
LAB_001030da:
    uVar16 = (ulong)uVar14;
  }
  else {
    iVar3 = query_attr(listen_info,CM_IP_PORT,0,&attr_port_num);
    uVar14 = attr_port_num;
    if (iVar3 != 0) {
      if (0xffff < (uint)attr_port_num) {
        fprintf(_stderr,"Requested port number %d is invalid\n",(ulong)(uint)attr_port_num);
        return (attr_list)0x0;
      }
      goto LAB_001030da;
    }
    uVar16 = 0;
  }
  p_Var18 = local_178;
  __fd = 0;
  (*svc->trace_out)(local_178,"CMSocket begin listen, requested port %d",(ulong)uVar14);
  get_IP_config(host_name,0x100,&IP,&port_range_low,&port_range_high,&use_hostname,local_150,
                svc->trace_out,p_Var18);
  sock_addr.sin_family = 2;
  sock_addr.sin_port = (ushort)uVar16 << 8 | (ushort)uVar16 >> 8;
  sock_addr.sin_addr.s_addr = 0;
  if ((long)*(int *)(p_Var12 + 0x10) < 1) {
LAB_001031f6:
    __fd = socket(2,1,0);
    p_Var18 = local_178;
    if (__fd == 0xffffffff) {
      libcmsockets_LTX_non_blocking_listen_cold_9();
      return (attr_list)0x0;
    }
    if (sock_addr.sin_port == 0) {
      if (port_range_high == -1) {
        sock_addr.sin_port = 0;
        (*svc->trace_out)(local_178,"CMSocket trying to bind to any available port");
        iVar3 = bind(__fd,(sockaddr *)&sock_addr,0x10);
        if (iVar3 == -1) {
          libcmsockets_LTX_non_blocking_listen_cold_8();
          return (attr_list)0x0;
        }
      }
      else {
        local_150 = p_Var12;
        tVar6 = time((time_t *)0x0);
        _Var4 = getpid();
        iVar3 = port_range_high - port_range_low;
        srand((int)tVar6 + _Var4);
        iVar11 = 0x1d;
        do {
          iVar17 = port_range_low;
          iVar5 = rand();
          uVar13 = (short)(iVar5 % iVar3) + (short)iVar17;
          sock_addr.sin_port = uVar13 * 0x100 | uVar13 >> 8;
          (*svc->trace_out)(local_178,"CMSocket trying to bind port %d");
          iVar5 = bind(__fd,(sockaddr *)&sock_addr,0x10);
          iVar17 = iVar11;
          if (iVar5 != -1) {
            iVar17 = 0;
          }
          if (iVar17 * -0x33333333 + 0xccccccccU < 0x33333333) {
            tVar6 = time((time_t *)0x0);
            _Var4 = getpid();
            srand((int)tVar6 + _Var4);
          }
          if (iVar17 == 0x14) {
            iVar3 = iVar3 * 10;
          }
          iVar2 = iVar3 * 10;
          if (iVar17 != 10) {
            iVar2 = iVar3;
          }
          iVar3 = iVar2;
          iVar11 = iVar11 + -1;
        } while (0 < iVar17);
        p_Var12 = local_150;
        p_Var18 = local_178;
        if (iVar5 == -1) {
          libcmsockets_LTX_non_blocking_listen_cold_5();
          return (attr_list)0x0;
        }
      }
    }
    else {
      iVar3 = setsockopt(__fd,1,2,&sock_opt_val,4);
      if (iVar3 != 0) {
        libcmsockets_LTX_non_blocking_listen_cold_2();
        return (attr_list)0x0;
      }
      sock_opt_val = 1;
      iVar3 = setsockopt(__fd,1,0xf,&sock_opt_val,4);
      p_Var18 = local_178;
      if (iVar3 != 0) {
        libcmsockets_LTX_non_blocking_listen_cold_3();
        return (attr_list)0x0;
      }
      (*svc->trace_out)(local_178,"CMSocket trying to bind selected port %d",uVar16 & 0xffff);
      iVar3 = bind(__fd,(sockaddr *)&sock_addr,0x10);
      if (iVar3 == -1) {
        libcmsockets_LTX_non_blocking_listen_cold_4();
        return (attr_list)0x0;
      }
    }
    iVar3 = listen(__fd,0x400);
    if (iVar3 != 0) {
      libcmsockets_LTX_non_blocking_listen_cold_6();
      return (attr_list)0x0;
    }
    (*svc->trace_out)(p_Var18,"CMSockets Adding socket_accept_conn as action on fd %d",(ulong)__fd);
    (*svc->fd_add_select)(p_Var18,__fd,socket_accept_conn,local_140,(void *)(long)(int)__fd);
    length = 0x10;
    iVar3 = getsockname(__fd,(sockaddr *)&sock_addr,&length);
    if (iVar3 < 0) {
      libcmsockets_LTX_non_blocking_listen_cold_7();
      return (attr_list)0x0;
    }
    pvVar7 = realloc(*(void **)(p_Var12 + 0x18),(long)*(int *)(p_Var12 + 0x10) * 4 + 4);
    *(void **)(p_Var12 + 0x18) = pvVar7;
    pvVar7 = realloc(*(void **)(p_Var12 + 0x20),(long)*(int *)(p_Var12 + 0x10) * 4 + 4);
    *(void **)(p_Var12 + 0x20) = pvVar7;
    *(uint *)(*(long *)(p_Var12 + 0x18) + (long)*(int *)(p_Var12 + 0x10) * 4) = __fd;
    uVar13 = sock_addr.sin_port << 8 | sock_addr.sin_port >> 8;
    iVar3 = *(int *)(p_Var12 + 0x10);
    *(uint *)((long)pvVar7 + (long)iVar3 * 4) = (uint)uVar13;
    *(int *)(p_Var12 + 0x10) = iVar3 + 1;
  }
  else {
    lVar15 = 0;
    do {
      uVar14 = *(uint *)(*(long *)(p_Var12 + 0x20) + lVar15 * 4);
      if ((uVar14 == ((uint)uVar16 & 0xffff)) ||
         ((port_range_low <= (int)uVar14 && ((int)uVar14 <= port_range_high)))) {
        __fd = *(uint *)(*(long *)(p_Var12 + 0x18) + lVar15 * 4);
      }
      lVar15 = lVar15 + 1;
    } while (*(int *)(p_Var12 + 0x10) != lVar15);
    if (__fd == 0) goto LAB_001031f6;
    length = 0x10;
    iVar3 = getsockname(__fd,(sockaddr *)&sock_addr,&length);
    p_Var18 = local_178;
    if (iVar3 < 0) {
      libcmsockets_LTX_non_blocking_listen_cold_1();
      return (attr_list)0x0;
    }
    (*svc->trace_out)(local_178,"CMSockets reusing prior listen, fd %d, port %d\n",(ulong)__fd,
                      (ulong)(ushort)(sock_addr.sin_port << 8 | sock_addr.sin_port >> 8));
    uVar13 = sock_addr.sin_port << 8 | sock_addr.sin_port >> 8;
  }
  (*svc->trace_out)(p_Var18,"CMSocket listen succeeded on port %d, fd %d",(ulong)uVar13,(ulong)__fd)
  ;
  p_Var8 = (attr_list)create_attr_list();
  if (*(void **)(p_Var12 + 8) != (void *)0x0) {
    (*svc->free_func)(*(void **)(p_Var12 + 8));
  }
  pcVar9 = strdup(host_name);
  *(char **)(p_Var12 + 8) = pcVar9;
  if (use_hostname == 0 && IP != 0) {
    add_attr(p_Var8,CM_IP_ADDR,1);
  }
  iVar3 = use_hostname;
  pcVar9 = getenv("CMSocketsUseHostname");
  aVar1 = CM_IP_HOSTNAME;
  if ((pcVar9 == (char *)0x0) && (iVar3 == 0)) {
    if (IP != 0) goto LAB_0010355c;
    pcVar9 = (char *)0x7f000001;
    uVar10 = 1;
    aVar1 = CM_IP_ADDR;
  }
  else {
    pcVar9 = strdup(host_name);
    uVar10 = 3;
  }
  add_attr(p_Var8,aVar1,uVar10,pcVar9);
LAB_0010355c:
  add_attr(p_Var8,CM_IP_PORT,1,uVar13);
  return p_Var8;
}

Assistant:

extern attr_list
libcmsockets_LTX_non_blocking_listen(CManager cm, CMtrans_services svc, transport_entry trans, attr_list listen_info)
{
    socket_client_data_ptr sd = trans->trans_data;
    unsigned int length;
    struct sockaddr_in sock_addr;
    int sock_opt_val = 1;
    SOCKET conn_sock = 0;
    int attr_port_num = 0;
    u_short port_num = 0;
    int port_range_low, port_range_high;
    int use_hostname = 0;
    int IP;
    char host_name[256];

    if (sd->cm) {
	/* assert CM is locked */
	assert(CM_LOCKED(svc, sd->cm));
    }
    /* 
     *  Check to see if a bind to a specific port was requested
     */
    if (listen_info != NULL
	&& !query_attr(listen_info, CM_IP_PORT,
		       NULL, (attr_value *)(intptr_t) & attr_port_num)) {
	port_num = 0;
    } else {
	if (attr_port_num > USHRT_MAX || attr_port_num < 0) {
	    fprintf(stderr, "Requested port number %d is invalid\n", attr_port_num);
	    return NULL;
	}
	port_num = attr_port_num;
    }

    svc->trace_out(cm, "CMSocket begin listen, requested port %d", attr_port_num);
    get_IP_config(host_name, sizeof(host_name), &IP, &port_range_low, &port_range_high, 
		  &use_hostname, listen_info, svc->trace_out, (void *)cm);

    sock_addr.sin_family = AF_INET;
    sock_addr.sin_addr.s_addr = INADDR_ANY;
    sock_addr.sin_port = htons(port_num);

    for (int i = 0; i < sd->listen_count; i++) {
	if ((sd->listen_ports[i] == port_num) ||
	    ((sd->listen_ports[i] >= port_range_low) &&
	     (sd->listen_ports[i] <= port_range_high))) {
	    conn_sock = sd->listen_fds[i];
	}
    }
    if (!conn_sock) {
	conn_sock = socket(AF_INET, SOCK_STREAM, 0);
	if (conn_sock == SOCKET_ERROR) {
	    fprintf(stderr, "Cannot open INET socket\n");
	    return NULL;
	}
	if (sock_addr.sin_port != 0) {
	    /* specific port requested. set REUSEADDR, REUSEPORT because previous server might have died badly */
	    if (setsockopt(conn_sock, SOL_SOCKET, SO_REUSEADDR, (char *) &sock_opt_val,
			   sizeof(sock_opt_val)) != 0) {
		fprintf(stderr, "Failed to set REUSEADDR on INET socket before bind\n");
		perror("setsockopt(SO_REUSEADDR) failed");
		return NULL;
	    }
#ifdef SO_REUSEPORT
	    sock_opt_val = 1;
	    if (setsockopt(conn_sock, SOL_SOCKET, SO_REUSEPORT, (const char*)&sock_opt_val, sizeof(sock_opt_val)) != 0) {
		fprintf(stderr, "Failed to set REUSEADDR on INET socket before bind\n");
		perror("setsockopt(SO_REUSEPORT) failed");
		return NULL;
	    }
#endif
	    svc->trace_out(cm, "CMSocket trying to bind selected port %d", port_num);
	    if (bind(conn_sock, (struct sockaddr *) &sock_addr,
		     sizeof sock_addr) == SOCKET_ERROR) {
		fprintf(stderr, "Cannot bind INET socket\n");
		return NULL;
	    }
	} else if (port_range_high == -1) {
	    /* bind to any port, range unconstrained */
	    sock_addr.sin_port = 0;
	    svc->trace_out(cm, "CMSocket trying to bind to any available port");
	    if (bind(conn_sock, (struct sockaddr *) &sock_addr,
		     sizeof sock_addr) == SOCKET_ERROR) {
		fprintf(stderr, "Cannot bind INET socket\n");
		return NULL;
	    }
	} else {
	    long seedval = (long) time(NULL) + getpid();
	    /* port num is free.  Constrain to range to standards */
	    int size = port_range_high - port_range_low;
	    int tries = 30;
	    int result = SOCKET_ERROR;
	    srand(seedval);
	    while (tries > 0) {
		int target = port_range_low + (rand() % size);
		sock_addr.sin_port = htons(target);
		svc->trace_out(cm, "CMSocket trying to bind port %d", target);
		result = bind(conn_sock, (struct sockaddr *) &sock_addr,
			      sizeof sock_addr);
		tries--;
		if (result != SOCKET_ERROR) tries = 0;
		if (tries%5 == 4) {
		    /* try reseeding in case we're in sync with another process */
		    srand((int)time(NULL) + (int)getpid());
		}
		if (tries == 20) {
		    /* damn, tried a lot, increase the range (This might violate specified range) */
		    size *= 10;
		}
		if (tries == 10) {
		    /* damn, tried a lot more, increase the range (This might violate specified range) */
		    size *= 10;
		}
	    }
	    if (result == SOCKET_ERROR) {
		fprintf(stderr, "Cannot bind INET socket\n");
		return NULL;
	    }
	}
	/* begin listening for conns and set the backlog */
	if (listen(conn_sock, FD_SETSIZE)) {
	    fprintf(stderr, "listen failed\n");
	    return NULL;
	}
	svc->trace_out(cm, "CMSockets Adding socket_accept_conn as action on fd %d", conn_sock);
	svc->fd_add_select(cm, conn_sock, (select_list_func)socket_accept_conn,
			   (void *) trans, (void *) (intptr_t)conn_sock);

	length = sizeof(sock_addr);
	if (getsockname(conn_sock, (struct sockaddr *) &sock_addr, &length) < 0) {
	    fprintf(stderr, "Cannot get socket name\n");
	    return NULL;
	}
	sd->listen_fds = realloc(sd->listen_fds,
				 sizeof(SOCKET)*(sd->listen_count+1));
	sd->listen_ports = realloc(sd->listen_ports,
				 sizeof(int)*(sd->listen_count+1));
	sd->listen_fds[sd->listen_count] = conn_sock;
	sd->listen_ports[sd->listen_count] = ntohs(sock_addr.sin_port);
	sd->listen_count++;
    } else {
	length = sizeof(sock_addr);
	if (getsockname(conn_sock, (struct sockaddr *) &sock_addr, &length) < 0) {
	    fprintf(stderr, "Cannot get socket name\n");
	    return NULL;
	}
	svc->trace_out(cm, "CMSockets reusing prior listen, fd %d, port %d\n", conn_sock, ntohs(sock_addr.sin_port));
    }
    /* set the port num as one we can be contacted at */
    {
	int int_port_num = ntohs(sock_addr.sin_port);
	attr_list ret_list;

	svc->trace_out(cm, "CMSocket listen succeeded on port %d, fd %d",
		       int_port_num, conn_sock);
	ret_list = create_attr_list();

	if (sd->hostname != NULL)
	    svc->free_func(sd->hostname);
	sd->hostname = strdup(host_name);
	if ((IP != 0) && (!use_hostname)) {
	    add_attr(ret_list, CM_IP_ADDR, Attr_Int4,
		     (attr_value) (intptr_t)IP);
	}
	if ((getenv("CMSocketsUseHostname") != NULL) || 
	    use_hostname) {
	    add_attr(ret_list, CM_IP_HOSTNAME, Attr_String,
		     (attr_value) strdup(host_name));
	} else if (IP == 0) {
	    add_attr(ret_list, CM_IP_ADDR, Attr_Int4, 
		     (attr_value)INADDR_LOOPBACK);
	}
	add_attr(ret_list, CM_IP_PORT, Attr_Int4,
		 (attr_value) (intptr_t)int_port_num);

	return ret_list;
    }
}